

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.cpp
# Opt level: O0

void __thiscall Assimp::BatchData::BatchData(BatchData *this,IOSystem *pIO,bool validate)

{
  Importer *this_00;
  bool validate_local;
  IOSystem *pIO_local;
  BatchData *this_local;
  
  this->pIOSystem = pIO;
  this->pImporter = (Importer *)0x0;
  std::__cxx11::list<Assimp::LoadRequest,_std::allocator<Assimp::LoadRequest>_>::list
            (&this->requests);
  std::__cxx11::string::string((string *)&this->pathBase);
  this->next_id = 0xffff;
  this->validate = validate;
  if (pIO != (IOSystem *)0x0) {
    this_00 = (Importer *)operator_new(8);
    Importer::Importer(this_00);
    this->pImporter = this_00;
    Importer::SetIOHandler(this->pImporter,pIO);
    return;
  }
  __assert_fail("nullptr != pIO",
                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Common/BaseImporter.cpp"
                ,0x1fd,"Assimp::BatchData::BatchData(IOSystem *, bool)");
}

Assistant:

BatchData( IOSystem* pIO, bool validate )
    : pIOSystem( pIO )
    , pImporter( nullptr )
    , next_id(0xffff)
    , validate( validate ) {
        ai_assert( nullptr != pIO );
        
        pImporter = new Importer();
        pImporter->SetIOHandler( pIO );
    }